

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cc
# Opt level: O2

void __thiscall tchecker::ite_expression_t::output(ite_expression_t *this)

{
  ostream *in_RSI;
  
  output((ite_expression_t *)(&this->field_0x0 + *(long *)(*(long *)this + -0x30)),in_RSI);
  return;
}

Assistant:

std::ostream & ite_expression_t::output(std::ostream & os) const
{
  os << "if ";
  condition().output(os);
  os << " then ";
  then_value().output(os);
  os << " else ";
  else_value().output(os);
  return os;
}